

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_temporary.h
# Opt level: O0

void __thiscall
sc_core::sc_vpool<sc_dt::sc_unsigned_bitref>::sc_vpool
          (sc_vpool<sc_dt::sc_unsigned_bitref> *this,int log2,sc_unsigned_bitref *pool_p)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  ulong uVar3;
  ulong *in_RDX;
  byte in_SIL;
  undefined8 *in_RDI;
  ulong uVar4;
  sc_unsigned_bitref *in_stack_ffffffffffffff50;
  ulong *local_90;
  ulong *local_70;
  
  *in_RDI = 0;
  local_70 = in_RDX;
  if (in_RDX == (ulong *)0x0) {
    uVar2 = 1L << (in_SIL & 0x3f);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar2;
    uVar3 = SUB168(auVar1 * ZEXT816(0x18),0);
    uVar4 = uVar3 + 8;
    if (SUB168(auVar1 * ZEXT816(0x18),8) != 0 || 0xfffffffffffffff7 < uVar3) {
      uVar4 = 0xffffffffffffffff;
    }
    local_70 = (ulong *)operator_new__(uVar4);
    *local_70 = uVar2;
    local_70 = local_70 + 1;
    if (uVar2 != 0) {
      local_90 = local_70;
      do {
        sc_dt::sc_unsigned_bitref::sc_unsigned_bitref(in_stack_ffffffffffffff50);
        local_90 = local_90 + 3;
      } while (local_90 != local_70 + uVar2 * 3);
    }
  }
  in_RDI[1] = local_70;
  in_RDI[2] = -1L << (in_SIL & 0x3f) ^ 0xffffffffffffffff;
  return;
}

Assistant:

sc_vpool<T>::sc_vpool( int log2, T* pool_p )
  : m_pool_i( 0 )
  , m_pool_p( pool_p ? pool_p : new T[static_cast<std::size_t>(1) << log2] )
  , m_wrap( ~(static_cast<std::size_t>(-1) << log2) )
{
	// if ( log2 > 32 ) SC_REPORT_ERROR(SC_ID_POOL_SIZE_, "");
}